

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddLinear.c
# Opt level: O3

void cuddUpdateInteractionMatrix(DdManager *table,int xindex,int yindex)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  if (0 < yindex) {
    iVar3 = 0;
    do {
      if ((xindex != iVar3) && (iVar1 = cuddTestInteract(table,iVar3,yindex), iVar1 != 0)) {
        iVar1 = iVar3;
        iVar2 = xindex;
        if (iVar3 < xindex) {
          iVar1 = xindex;
          iVar2 = iVar3;
        }
        cuddSetInteract(table,iVar2,iVar1);
      }
      iVar3 = iVar3 + 1;
    } while (yindex != iVar3);
  }
  for (iVar3 = yindex + 1; iVar3 < table->size; iVar3 = iVar3 + 1) {
    if ((xindex != iVar3) && (iVar1 = cuddTestInteract(table,yindex,iVar3), iVar1 != 0)) {
      iVar1 = iVar3;
      iVar2 = xindex;
      if (iVar3 < xindex) {
        iVar1 = xindex;
        iVar2 = iVar3;
      }
      cuddSetInteract(table,iVar2,iVar1);
    }
  }
  return;
}

Assistant:

void
cuddUpdateInteractionMatrix(
  DdManager * table,
  int  xindex,
  int  yindex)
{
    int i;
    for (i = 0; i < yindex; i++) {
        if (i != xindex && cuddTestInteract(table,i,yindex)) {
            if (i < xindex) {
                cuddSetInteract(table,i,xindex);
            } else {
                cuddSetInteract(table,xindex,i);
            }
        }
    }
    for (i = yindex+1; i < table->size; i++) {
        if (i != xindex && cuddTestInteract(table,yindex,i)) {
            if (i < xindex) {
                cuddSetInteract(table,i,xindex);
            } else {
                cuddSetInteract(table,xindex,i);
            }
        }
    }

}